

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O2

void __thiscall
MainWindow::configureActions(MainWindow *this,QWidget *widget,ShortcutTable *shortcuts)

{
  QAction *this_00;
  char cVar1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  QMenu *widget_00;
  QVariant _data;
  QKeySequence local_70 [8];
  QArrayDataPointer<QAction_*> local_68;
  QVariant local_50;
  
  QWidget::actions();
  iVar3 = QList<QAction_*>::begin((QList<QAction_*> *)&local_68);
  iVar4 = QList<QAction_*>::end((QList<QAction_*> *)&local_68);
  for (; iVar3.i != iVar4.i; iVar3.i = iVar3.i + 1) {
    this_00 = *iVar3.i;
    cVar1 = QAction::isSeparator();
    if (cVar1 == '\0') {
      widget_00 = QAction::menu<QMenu*>(this_00);
      if (widget_00 == (QMenu *)0x0) {
        QAction::data();
        bVar2 = QVariant::canConvert<ShortcutTable::Shortcut>(&local_50);
        if (bVar2) {
          qvariant_cast<ShortcutTable::Shortcut>(&local_50);
          ShortcutTable::get((ShortcutTable *)local_70,(Shortcut)shortcuts);
          QAction::setShortcut((QKeySequence *)this_00);
          QKeySequence::~QKeySequence(local_70);
        }
        QVariant::~QVariant(&local_50);
      }
      else {
        configureActions(this,(QWidget *)widget_00,shortcuts);
      }
    }
  }
  QArrayDataPointer<QAction_*>::~QArrayDataPointer(&local_68);
  return;
}

Assistant:

void MainWindow::configureActions(QWidget &widget, ShortcutTable const& shortcuts) {
    for (auto act : widget.actions()) {
        if (act->isSeparator()) {
            continue;
        } else if (auto menu = act->menu(); menu) {
            // recurse into this menu
            configureActions(*menu, shortcuts);
        } else {
            // check if this action has a shortcut
            auto const _data = act->data();
            if (_data.canConvert<ShortcutTable::Shortcut>()) {
                // yes, set the action's shortcut from the configuration
                act->setShortcut(shortcuts.get(_data.value<ShortcutTable::Shortcut>()));
            }
        }
    }
}